

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_32f1a0::Db::parsePointerToMemberType(Db *this)

{
  bool bVar1;
  Node *local_28;
  Node *MemberType;
  Node *ClassType;
  Db *this_local;
  
  ClassType = (Node *)this;
  bVar1 = consumeIf(this,'M');
  if (bVar1) {
    MemberType = parseType(this);
    if (MemberType == (Node *)0x0) {
      this_local = (Db *)0x0;
    }
    else {
      local_28 = parseType(this);
      if (local_28 == (Node *)0x0) {
        this_local = (Db *)0x0;
      }
      else {
        this_local = (Db *)(anonymous_namespace)::Db::
                           make<(anonymous_namespace)::PointerToMemberType,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                                     ((Db *)this,&MemberType,&local_28);
      }
    }
  }
  else {
    this_local = (Db *)0x0;
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parsePointerToMemberType() {
  if (!consumeIf('M'))
    return nullptr;
  Node *ClassType = parseType();
  if (ClassType == nullptr)
    return nullptr;
  Node *MemberType = parseType();
  if (MemberType == nullptr)
    return nullptr;
  return make<PointerToMemberType>(ClassType, MemberType);
}